

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O0

void __thiscall banksia::ChessBoard::takeBack(ChessBoard *this)

{
  Side SVar1;
  Hist *in_RDI;
  value_type hist;
  Hist *in_stack_ffffffffffffff68;
  Hist *in_stack_ffffffffffffff70;
  
  std::vector<banksia::Hist,_std::allocator<banksia::Hist>_>::back
            ((vector<banksia::Hist,_std::allocator<banksia::Hist>_> *)in_RDI);
  Hist::Hist(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::vector<banksia::Hist,_std::allocator<banksia::Hist>_>::pop_back
            ((vector<banksia::Hist,_std::allocator<banksia::Hist>_> *)0x1eba5f);
  SVar1 = BoardCore::getXSide(in_RDI->status);
  in_RDI->status = SVar1;
  (**(code **)&(((_Vector_base<banksia::Hist,_std::allocator<banksia::Hist>_> *)&in_RDI->move)->
               _M_impl).super__Vector_impl_data._M_start[1].status)(in_RDI,&stack0xffffffffffffff68)
  ;
  Hist::~Hist(in_RDI);
  return;
}

Assistant:

void ChessBoard::takeBack() {
    auto hist = histList.back();
    histList.pop_back();
    side = getXSide(side);
    takeBack(hist);
    //    hashKey = hist.hashKey;
    assert(hashKey == initHashKey());
}